

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

int CountNewlines(LPCOLESTR psz)

{
  OLECHAR OVar1;
  int cln;
  int iVar2;
  LPCOLESTR pOVar3;
  
  iVar2 = 0;
LAB_00d5166e:
  pOVar3 = psz;
  OVar1 = *pOVar3;
  if (OVar1 == L'\0') {
    return iVar2;
  }
  psz = pOVar3 + 1;
  if (OVar1 != L'\n') goto code_r0x00d5167e;
  goto LAB_00d5168f;
code_r0x00d5167e:
  if (OVar1 == L'\r') {
    if (*psz == L'\n') {
      psz = pOVar3 + 2;
    }
LAB_00d5168f:
    iVar2 = iVar2 + 1;
  }
  goto LAB_00d5166e;
}

Assistant:

int CountNewlines(LPCOLESTR psz)
{
    int cln = 0;

    while (0 != *psz)
    {
        switch (*psz++)
        {
        case _u('\xD'):
            if (*psz == _u('\xA'))
            {
                ++psz;
            }
            // fall-through
        case _u('\xA'):
            cln++;
            break;
        }
    }

    return cln;
}